

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

vector<Class,_std::allocator<Class>_> * __thiscall
Population::crossover
          (vector<Class,_std::allocator<Class>_> *__return_storage_ptr__,Population *this,
          vector<Class,_std::allocator<Class>_> *classes1,
          vector<Class,_std::allocator<Class>_> *classes2)

{
  size_type sVar1;
  mt19937 *__urng;
  ulong uVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  Class local_200;
  Class local_128;
  int local_4c;
  result_type_conflict1 local_48;
  int i;
  int border;
  uniform_int_distribution<int> local_34;
  uniform_int_distribution<int> int_distribution;
  vector<Class,_std::allocator<Class>_> *classes2_local;
  vector<Class,_std::allocator<Class>_> *classes1_local;
  Population *this_local;
  vector<Class,_std::allocator<Class>_> *classes;
  
  int_distribution._M_param._M_a._3_1_ = 0;
  unique0x1000017f = classes2;
  std::vector<Class,_std::allocator<Class>_>::vector(__return_storage_ptr__);
  sVar1 = std::vector<Class,_std::allocator<Class>_>::size(classes1);
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_34,0,(int)sVar1);
  __urng = random_engine();
  local_48 = std::uniform_int_distribution<int>::operator()(&local_34,__urng);
  for (local_4c = 0; uVar2 = (ulong)local_4c,
      sVar1 = std::vector<Class,_std::allocator<Class>_>::size(classes1), uVar2 < sVar1;
      local_4c = local_4c + 1) {
    if (local_4c < local_48) {
      pvVar3 = std::vector<Class,_std::allocator<Class>_>::operator[](classes1,(long)local_4c);
      pvVar4 = std::vector<Class,_std::allocator<Class>_>::operator[]
                         (stack0xffffffffffffffd8,(long)local_4c);
      crossover(&local_128,this,pvVar3,pvVar4);
      std::vector<Class,_std::allocator<Class>_>::push_back(__return_storage_ptr__,&local_128);
      Class::~Class(&local_128);
    }
    else {
      pvVar3 = std::vector<Class,_std::allocator<Class>_>::operator[]
                         (stack0xffffffffffffffd8,(long)local_4c);
      pvVar4 = std::vector<Class,_std::allocator<Class>_>::operator[](classes1,(long)local_4c);
      crossover(&local_200,this,pvVar3,pvVar4);
      std::vector<Class,_std::allocator<Class>_>::push_back(__return_storage_ptr__,&local_200);
      Class::~Class(&local_200);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Class> Population::crossover(const vector<Class>& classes1,
                                    const vector<Class>& classes2) const {
    vector<Class> classes;
    uniform_int_distribution<int> int_distribution(0, classes1.size());
    int border = int_distribution(random_engine());
    for (int i = 0; i < classes1.size(); ++i) {
        if (i < border) {
            classes.push_back(crossover(classes1[i], classes2[i]));
        } else {
            classes.push_back(crossover(classes2[i], classes1[i]));
        }
    }
    return classes;
}